

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void __thiscall
CVmPackGroup::CVmPackGroup
          (CVmPackGroup *this,CVmPackGroup *parent,wchar_t open_paren,CVmPackPos *pos,CVmPackType *t
          )

{
  size_t sVar1;
  int in_EDX;
  char *in_RSI;
  CVmPackPos *in_RDI;
  long in_R8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar2;
  
  (in_RDI->p).p_ = in_RSI;
  CVmPackPos::CVmPackPos
            (in_RDI,(CVmPackPos *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  in_RDI[2].p.p_ = *(char **)(in_RSI + 0x30);
  sVar1 = (**(code **)(*(long *)in_RDI[2].p.p_ + 0x38))();
  in_RDI[2].len = sVar1;
  in_RDI[2].idx = 1;
  *(undefined4 *)((long)&in_RDI->len + 4) = *(undefined4 *)(in_R8 + 0x20);
  in_RDI->idx = *(int *)(in_R8 + 0x38);
  *(undefined4 *)&in_RDI->field_0x14 = *(undefined4 *)(in_R8 + 0x3c);
  *(undefined4 *)&in_RDI[2].field_0x14 = *(undefined4 *)(in_R8 + 0x24);
  *(undefined4 *)&in_RDI[3].p.p_ = *(undefined4 *)(in_R8 + 0x30);
  if (in_EDX == 0x28) {
    uVar2 = 0x29;
  }
  else if (in_EDX == 0x5b) {
    uVar2 = 0x5d;
  }
  else {
    uVar2 = 0;
    if (in_EDX == 0x7b) {
      uVar2 = 0x7d;
    }
  }
  *(undefined4 *)&in_RDI->len = uVar2;
  return;
}

Assistant:

CVmPackGroup(CVmPackGroup *parent, wchar_t open_paren,
                 CVmPackPos *pos, const CVmPackType *t)
        : parent(parent), start(pos)
    {
        ds = parent->ds;
        stream_ofs = ds->get_pos();
        cur_iter = 1;
        big_endian = t->big_endian;
        tilde = t->tilde;
        pct = t->pct;
        num_iters = t->count;
        up_to_iters = t->up_to_count;
        close_paren = (open_paren == '(' ? ')' :
                       open_paren == '[' ? ']' :
                       open_paren == '{' ? '}' : 0);
    }